

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O1

char * Diligent::anon_unknown_25::ArchiveDeviceTypeToString(Uint32 dev)

{
  char *pcVar1;
  string msg;
  string local_28;
  
  if (dev < 7) {
    pcVar1 = &DAT_0076cef0 + *(int *)(&DAT_0076cef0 + (ulong)dev * 4);
  }
  else {
    FormatString<char[23]>(&local_28,(char (*) [23])"Unexpected device type");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"ArchiveDeviceTypeToString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x139);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = "unknown";
  }
  return pcVar1;
}

Assistant:

const char* ArchiveDeviceTypeToString(Uint32 dev)
{
    using DeviceType = DeviceObjectArchive::DeviceType;
    static_assert(static_cast<Uint32>(DeviceType::Count) == 7, "Please handle the new archive device type below");
    switch (static_cast<DeviceType>(dev))
    {
            // clang-format off
        case DeviceType::OpenGL:      return "OpenGL";
        case DeviceType::Direct3D11:  return "Direct3D11";
        case DeviceType::Direct3D12:  return "Direct3D12";
        case DeviceType::Vulkan:      return "Vulkan";
        case DeviceType::Metal_MacOS: return "Metal for MacOS";
        case DeviceType::Metal_iOS:   return "Metal for iOS";
        case DeviceType::WebGPU:      return "WebGPU";
        // clang-format on
        default:
            UNEXPECTED("Unexpected device type");
            return "unknown";
    }
}